

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall cs_impl::runtime_cs_ext::await_s(runtime_cs_ext *this,var *func,array *args)

{
  bool bVar1;
  type_info *ptVar2;
  object_method *poVar3;
  initializer_list<cs_impl::any> __l;
  allocator_type local_d1;
  any local_d0;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_c8;
  vector local_b0;
  async_callable local_98;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_58;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_38;
  
  ptVar2 = any::type(func);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::callable::typeinfo);
  if (bVar1) {
    local_38._M_cur =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_38._M_first =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_38._M_last =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_38._M_node =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_node;
    local_58._M_cur =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_cur;
    local_58._M_first =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_first;
    local_58._M_last =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_last;
    local_58._M_node =
         (args->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_finish._M_node;
    std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
    vector<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
              ((vector<cs_impl::any,std::allocator<cs_impl::any>> *)&local_b0,&local_38,&local_58,
               (allocator_type *)&local_d0);
    async_callable::async_callable(&local_98,func,&local_b0);
    fiber::await<cs_impl::runtime_cs_ext::async_callable>((async_callable *)this);
    async_callable::~async_callable(&local_98);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_b0);
  }
  else {
    ptVar2 = any::type(func);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::object_method::typeinfo);
    if (bVar1) {
      poVar3 = any::const_val<cs::object_method>(func);
      local_d0.mDat = (poVar3->object).mDat;
      if (local_d0.mDat != (proxy *)0x0) {
        (local_d0.mDat)->refcount = (local_d0.mDat)->refcount + 1;
      }
      __l._M_len = 1;
      __l._M_array = &local_d0;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&local_c8,__l,&local_d1);
      async_callable::async_callable(&local_98,&poVar3->callable,&local_c8,args);
      fiber::await<cs_impl::runtime_cs_ext::async_callable>((async_callable *)this);
      async_callable::~async_callable(&local_98);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_c8);
      any::recycle(&local_d0);
    }
    else {
      any::any<cs::pointer>((any *)this,(pointer *)&cs::null_pointer);
    }
  }
  return (var)(proxy *)this;
}

Assistant:

var await_s(const var &func, const array &args)
		{
			if (func.type() == typeid(callable)) {
				return fiber::await(async_callable(func, vector(args.begin(), args.end())));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				return fiber::await(async_callable(om.callable, {om.object}, args));
			}
			return null_pointer;
		}